

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O1

void Wln_WriteTables(FILE *pFile,Wln_Ntk_t *p)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  void *__s;
  long lVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  long lVar10;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  undefined8 *puVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  
  if (p->vTables != (Vec_Ptr_t *)0x0) {
    uVar12 = p->vTables->nSize;
    if ((long)(int)uVar12 != 0) {
      uVar6 = 0x10;
      if (0x10 < uVar12) {
        uVar6 = uVar12;
      }
      __s = malloc((long)(int)uVar6 << 2);
      if (__s != (void *)0x0) {
        memset(__s,0,(long)(int)uVar12 * 4);
      }
      lVar7 = (long)(p->vTypes).nSize;
      if (1 < lVar7) {
        piVar2 = (p->vTypes).pArray;
        lVar10 = 1;
        lVar13 = 0x18;
        do {
          if (piVar2[lVar10] == 0x4d) {
            puVar15 = (undefined8 *)((long)&p->vFanins->nCap + lVar13);
            if (2 < *(int *)((long)p->vFanins + lVar13 + -4)) {
              puVar15 = (undefined8 *)*puVar15;
            }
            iVar9 = *(int *)((long)puVar15 + 4);
            if (((long)iVar9 < 0) || ((int)uVar12 <= iVar9)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(int *)((long)__s + (long)iVar9 * 4) = (int)lVar10;
          }
          lVar10 = lVar10 + 1;
          lVar13 = lVar13 + 0x10;
        } while (lVar7 != lVar10);
      }
      pVVar8 = p->vTables;
      if (0 < pVVar8->nSize) {
        uVar17 = 0;
        uVar18 = (ulong)uVar12;
        if ((int)uVar12 < 1) {
          uVar18 = uVar17;
        }
        do {
          if (uVar18 == uVar17) {
LAB_00389e25:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar9 = *(int *)((long)__s + uVar17 * 4);
          paVar11 = &p->vFanins[iVar9].field_2;
          if (2 < p->vFanins[iVar9].nSize) {
            paVar11 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar11->pArray[0];
          }
          iVar14 = paVar11->Array[0];
          if (((long)iVar14 < 0) || (iVar1 = (p->vRanges).nSize, iVar1 <= iVar14))
          goto LAB_00389e25;
          piVar2 = (p->vRanges).pArray;
          iVar14 = piVar2[iVar14];
          if (iVar14 < 0) {
LAB_00389e44:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          pVVar3 = p->pRanges->vObjs;
          uVar12 = iVar14 * 4;
          iVar14 = pVVar3->nSize;
          if (iVar14 <= (int)uVar12) goto LAB_00389e44;
          piVar4 = pVVar3->pArray;
          iVar16 = piVar4[uVar12] - piVar4[(ulong)uVar12 + 1];
          iVar5 = -iVar16;
          if (0 < iVar16) {
            iVar5 = iVar16;
          }
          if ((iVar9 < 0) || (iVar1 <= iVar9)) goto LAB_00389e25;
          iVar9 = piVar2[iVar9];
          if ((iVar9 < 0) || (uVar12 = iVar9 * 4, iVar14 <= (int)uVar12)) goto LAB_00389e44;
          iVar14 = piVar4[uVar12] - piVar4[(ulong)uVar12 + 1];
          iVar9 = -iVar14;
          if (0 < iVar14) {
            iVar9 = iVar14;
          }
          Wln_WriteTableOne(pFile,iVar5 + 1,iVar9 + 1,(word *)pVVar8->pArray[uVar17],(int)uVar17);
          uVar17 = uVar17 + 1;
          pVVar8 = p->vTables;
        } while ((long)uVar17 < (long)pVVar8->nSize);
      }
      if (__s != (void *)0x0) {
        free(__s);
        return;
      }
    }
  }
  return;
}

Assistant:

void Wln_WriteTables( FILE * pFile, Wln_Ntk_t * p )
{
    Vec_Int_t * vNodes;
    word * pTable; 
    int i, iObj;
    if ( p->vTables == NULL || Vec_PtrSize(p->vTables) == 0 )
        return;
    // map tables into their nodes
    vNodes = Vec_IntStart( Vec_PtrSize(p->vTables) );
    Wln_NtkForEachObj( p, iObj )
        if ( Wln_ObjType(p, iObj) == ABC_OPER_TABLE )
            Vec_IntWriteEntry( vNodes, Wln_ObjFanin1(p, iObj), iObj );
    // write tables
    Vec_PtrForEachEntry( word *, p->vTables, pTable, i )
    {
        int iNode  = Vec_IntEntry( vNodes, i );
        int iFanin = Wln_ObjFanin0( p, iNode );
        Wln_WriteTableOne( pFile, Wln_ObjRange(p, iFanin), Wln_ObjRange(p, iNode), pTable, i );
    }
    Vec_IntFree( vNodes );
}